

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O2

bool __thiscall Dependency::mergeIfSameAs(Dependency *this,Dependency *dep2)

{
  int iVar1;
  int iVar2;
  int i;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)dep2);
  iVar1 = std::__cxx11::string::compare((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (iVar1 == 0) {
    i = 0;
    iVar2 = (int)((ulong)((long)(this->symlinks).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->symlinks).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar2 != i; i = i + 1) {
      getSymlink_abi_cxx11_(&local_50,this,i);
      addSymlink(dep2,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return iVar1 == 0;
}

Assistant:

bool Dependency::mergeIfSameAs(Dependency& dep2)
{
    if(dep2.getOriginalFileName().compare(filename) == 0)
    {
        const int samount = getSymlinkAmount();
        for(int n=0; n<samount; n++) {
            dep2.addSymlink(getSymlink(n));
        }
        return true;
    }
    return false;
}